

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtGImpactCollisionAlgorithm::gimpact_vs_shape_find_pairs
          (cbtGImpactCollisionAlgorithm *this,cbtTransform *trans0,cbtTransform *trans1,
          cbtGImpactShapeInterface *shape0,cbtCollisionShape *shape1,
          cbtAlignedObjectArray<int> *collided_primitives)

{
  int *ptr;
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  cbtAABB boxshape;
  cbtTransform trans1to0;
  cbtAABB local_98;
  int *local_78;
  cbtTransform local_70;
  
  if ((shape0->m_box_set).m_box_tree.m_num_nodes == 0) {
    (*shape1->_vptr_cbtCollisionShape[2])(shape1,trans1,&local_98,&local_98.m_max);
    uVar1 = (*(shape0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x16])
                      (shape0);
    if (uVar1 != 0) {
      do {
        uVar1 = uVar1 - 1;
        (*(shape0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x1e])
                  (shape0,(ulong)uVar1,trans0,&local_70,local_70.m_basis.m_el + 1);
        if ((((local_98.m_min.m_floats[0] <= local_70.m_basis.m_el[1].m_floats[0]) &&
             (local_70.m_basis.m_el[0].m_floats[0] <= local_98.m_max.m_floats[0])) &&
            (local_98.m_min.m_floats[1] <= local_70.m_basis.m_el[1].m_floats[1])) &&
           (((local_70.m_basis.m_el[0].m_floats[1] <= local_98.m_max.m_floats[1] &&
             (local_98.m_min.m_floats[2] <= local_70.m_basis.m_el[1].m_floats[2])) &&
            (local_70.m_basis.m_el[0].m_floats[2] <= local_98.m_max.m_floats[2])))) {
          uVar5 = collided_primitives->m_size;
          if (uVar5 == collided_primitives->m_capacity) {
            iVar4 = uVar5 * 2;
            if (uVar5 == 0) {
              iVar4 = 1;
            }
            if ((int)uVar5 < iVar4) {
              if (iVar4 == 0) {
                piVar2 = (int *)0x0;
              }
              else {
                piVar2 = (int *)cbtAlignedAllocInternal((long)iVar4 << 2,0x10);
                uVar5 = collided_primitives->m_size;
              }
              ptr = collided_primitives->m_data;
              if ((int)uVar5 < 1) {
                if (ptr != (int *)0x0) goto LAB_008fafad;
              }
              else {
                uVar3 = 0;
                do {
                  piVar2[uVar3] = ptr[uVar3];
                  uVar3 = uVar3 + 1;
                } while (uVar5 != uVar3);
LAB_008fafad:
                if (collided_primitives->m_ownsMemory == true) {
                  local_78 = piVar2;
                  cbtAlignedFreeInternal(ptr);
                  piVar2 = local_78;
                }
                uVar5 = collided_primitives->m_size;
              }
              collided_primitives->m_ownsMemory = true;
              collided_primitives->m_data = piVar2;
              collided_primitives->m_capacity = iVar4;
            }
          }
          collided_primitives->m_data[(int)uVar5] = uVar1;
          collided_primitives->m_size = collided_primitives->m_size + 1;
        }
      } while (uVar1 != 0);
    }
  }
  else {
    cbtTransform::inverse(trans0);
    cbtTransform::operator*=(&local_70,trans1);
    (*shape1->_vptr_cbtCollisionShape[2])(shape1,&local_70,&local_98,&local_98.m_max);
    cbtGImpactQuantizedBvh::boxQuery(&shape0->m_box_set,&local_98,collided_primitives);
  }
  return;
}

Assistant:

void cbtGImpactCollisionAlgorithm::gimpact_vs_shape_find_pairs(
	const cbtTransform& trans0,
	const cbtTransform& trans1,
	const cbtGImpactShapeInterface* shape0,
	const cbtCollisionShape* shape1,
	cbtAlignedObjectArray<int>& collided_primitives)
{
	cbtAABB boxshape;

	if (shape0->hasBoxSet())
	{
		cbtTransform trans1to0 = trans0.inverse();
		trans1to0 *= trans1;

		shape1->getAabb(trans1to0, boxshape.m_min, boxshape.m_max);

		shape0->getBoxSet()->boxQuery(boxshape, collided_primitives);
	}
	else
	{
		shape1->getAabb(trans1, boxshape.m_min, boxshape.m_max);

		cbtAABB boxshape0;
		int i = shape0->getNumChildShapes();

		while (i--)
		{
			shape0->getChildAabb(i, trans0, boxshape0.m_min, boxshape0.m_max);

			if (boxshape.has_collision(boxshape0))
			{
				collided_primitives.push_back(i);
			}
		}
	}
}